

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_DsdManAddDsd(If_DsdMan_t *p,char *pDsd,word *pTruth,uchar *pPerm,int *pnSupp)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int *piVar7;
  uint uVar8;
  int pMatches [2000];
  char *local_1f90;
  int local_1f88 [12];
  int local_1f58 [2000];
  
  cVar1 = *pDsd;
  local_1f90 = pDsd;
  if (cVar1 == '!') {
    local_1f90 = pDsd + 1;
  }
  cVar2 = *local_1f90;
  if (cVar2 == '1') {
    if (local_1f90[1] == '\0') {
      uVar8 = 1;
      goto LAB_00425087;
    }
  }
  else if ((cVar2 == '0') && (local_1f90[1] == '\0')) {
    uVar8 = 0;
    goto LAB_00425087;
  }
  cVar2 = local_1f90[cVar2 == '!'];
  if ((byte)(cVar2 + 0x85U) < 0xe6) {
    if (*local_1f90 != '\0') {
      lVar4 = 0;
      iVar5 = 0;
      do {
        local_1f58[lVar4] = 0;
        bVar3 = local_1f90[lVar4];
        uVar8 = bVar3 - 0x28;
        if (uVar8 < 0x36) {
          if ((0x8000000100001U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
            if ((0x20000000400002U >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_00425007;
            goto LAB_00425023;
          }
LAB_00425013:
          lVar6 = (long)iVar5;
          iVar5 = iVar5 + 1;
          piVar7 = local_1f58 + lVar6 + -0xc;
LAB_00425036:
          *piVar7 = (int)lVar4;
        }
        else {
LAB_00425007:
          if (bVar3 == 0x7d) {
LAB_00425023:
            lVar6 = (long)iVar5;
            iVar5 = iVar5 + -1;
            piVar7 = local_1f58 + local_1f88[lVar6 + -1];
            goto LAB_00425036;
          }
          if (bVar3 == 0x7b) goto LAB_00425013;
        }
        if (0xb < iVar5) {
          __assert_fail("nNested < DAU_MAX_VAR",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x67d,"void If_DsdMergeMatches(char *, int *)");
        }
        lVar6 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (local_1f90[lVar6] != '\0');
      if (iVar5 != 0) {
        __assert_fail("nNested == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x67f,"void If_DsdMergeMatches(char *, int *)");
      }
    }
    uVar8 = If_DsdManAddDsd_rec(local_1f90,&local_1f90,local_1f58,p,pTruth,pPerm,pnSupp);
  }
  else {
    iVar5 = *pnSupp;
    *pnSupp = iVar5 + 1;
    pPerm[iVar5] = cVar2 + 0x9f;
    uVar8 = 2;
  }
LAB_00425087:
  return cVar1 == '!' ^ uVar8;
}

Assistant:

int If_DsdManAddDsd( If_DsdMan_t * p, char * pDsd, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    int iRes = -1, fCompl = 0;
    if ( *pDsd == '!' )
         pDsd++, fCompl = 1;
    if ( Dau_DsdIsConst0(pDsd) )
        iRes = 0;
    else if ( Dau_DsdIsConst1(pDsd) )
        iRes = 1;
    else if ( Dau_DsdIsVar(pDsd) )
    {
        pPerm[(*pnSupp)++] = Dau_DsdReadVar(pDsd);
        iRes = 2;
    }
    else
    {
        int pMatches[DAU_MAX_STR];
        If_DsdMergeMatches( pDsd, pMatches );
        iRes = If_DsdManAddDsd_rec( pDsd, &pDsd, pMatches, p, pTruth, pPerm, pnSupp );
    }
    return Abc_LitNotCond( iRes, fCompl );
}